

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool picojson::
     _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
               (default_parse_context *ctx,
               input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  lconv *plVar4;
  FILE *__stream;
  FILE *__stream_00;
  FILE *__stream_01;
  size_t sVar5;
  double f;
  char *local_58;
  char *endp;
  string num_str;
  
  __stream_01 = (FILE *)in;
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::skip_ws(in);
  iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc(in,__stream_01);
  if (iVar3 < 0x6e) {
    if (iVar3 == 0x22) {
      bVar2 = default_parse_context::
              parse_string<std::istreambuf_iterator<char,std::char_traits<char>>>(ctx,in);
      return bVar2;
    }
    if (iVar3 == 0x5b) {
      bVar2 = default_parse_context::parse_array_start(ctx);
      if (!bVar2) {
        return false;
      }
      bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x5d);
      if (bVar2) {
        return true;
      }
      sVar5 = 0;
      do {
        bVar2 = default_parse_context::
                parse_array_item<std::istreambuf_iterator<char,std::char_traits<char>>>
                          (ctx,in,sVar5);
        if (!bVar2) {
          return false;
        }
        sVar5 = sVar5 + 1;
        bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x2c);
      } while (bVar2);
      bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::expect(in,0x5d);
      return bVar2;
    }
    if (iVar3 != 0x66) {
LAB_00116c97:
      if (iVar3 != 0x2d && 9 < iVar3 - 0x30U) {
        input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                  (in,(int)__stream_01,__stream);
        return false;
      }
      input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                (in,(int)__stream_01,__stream);
      num_str._M_dataplus._M_p = (pointer)0x0;
      num_str._M_string_length._0_4_ = (uint)num_str._M_string_length & 0xffffff00;
      endp = (char *)&num_str._M_string_length;
LAB_00116cdb:
      do {
        iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc
                          (in,__stream_01);
        if (9 < iVar3 - 0x30U) {
          uVar1 = iVar3 - 0x2b;
          if (0x3a < uVar1) {
LAB_00116e10:
            input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::ungetc
                      (in,(int)__stream_01,__stream_00);
            if ((num_str._M_dataplus._M_p == (pointer)0x0) ||
               (f = strtod(endp,&local_58), local_58 != endp + (long)num_str._M_dataplus._M_p)) {
              bVar2 = false;
            }
            else {
              bVar2 = true;
              default_parse_context::set_number(ctx,f);
            }
            if ((size_type *)endp == &num_str._M_string_length) {
              return bVar2;
            }
            operator_delete(endp);
            return bVar2;
          }
          if ((0x400000004000005U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
            if ((ulong)uVar1 != 3) goto LAB_00116e10;
            plVar4 = localeconv();
            __stream_01 = (FILE *)plVar4->decimal_point;
            std::__cxx11::string::append((char *)&endp);
            goto LAB_00116cdb;
          }
        }
        __stream_01 = (FILE *)(ulong)(uint)(int)(char)iVar3;
        std::__cxx11::string::push_back((char)&endp);
      } while( true );
    }
    endp = (char *)&num_str._M_string_length;
    num_str._M_string_length._0_4_ = 0x65736c61;
    num_str._M_dataplus._M_p = (pointer)0x4;
    num_str._M_string_length._4_1_ = 0;
    bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                      (in,(string *)&endp);
    if (!bVar2) goto LAB_00116de3;
    bVar2 = default_parse_context::set_bool(ctx,false);
  }
  else {
    if (iVar3 == 0x7b) {
      bVar2 = _parse_object<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                        (ctx,in);
      return bVar2;
    }
    if (iVar3 == 0x74) {
      endp = (char *)&num_str._M_string_length;
      num_str._M_string_length._0_4_ = 0x657572;
      num_str._M_dataplus._M_p = (pointer)0x3;
      bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                        (in,(string *)&endp);
      if (!bVar2) {
LAB_00116de3:
        if ((size_type *)endp != &num_str._M_string_length) {
          operator_delete(endp);
          return false;
        }
        return false;
      }
      bVar2 = default_parse_context::set_bool(ctx,true);
    }
    else {
      if (iVar3 != 0x6e) goto LAB_00116c97;
      endp = (char *)&num_str._M_string_length;
      num_str._M_string_length._0_4_ = 0x6c6c75;
      num_str._M_dataplus._M_p = (pointer)0x3;
      bVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
                        (in,(string *)&endp);
      if (!bVar2) goto LAB_00116de3;
      bVar2 = default_parse_context::set_null(ctx);
    }
  }
  if ((size_type *)endp != &num_str._M_string_length) {
    operator_delete(endp);
  }
  if (bVar2 == false) {
    return false;
  }
  return true;
}

Assistant:

inline bool _parse(Context& ctx, input<Iter>& in) {
    in.skip_ws();
    int ch = in.getc();
    switch (ch) {
#define IS(ch, text, op) case ch: \
      if (in.match(text) && op) { \
    return true; \
      } else { \
    return false; \
      }
      IS('n', "ull", ctx.set_null());
      IS('f', "alse", ctx.set_bool(false));
      IS('t', "rue", ctx.set_bool(true));
#undef IS
    case '"':
      return ctx.parse_string(in);
    case '[':
      return _parse_array(ctx, in);
    case '{':
      return _parse_object(ctx, in);
    default:
      if (('0' <= ch && ch <= '9') || ch == '-') {
        double f;
        char *endp;
    in.ungetc();
        std::string num_str = _parse_number(in);
        if (num_str.empty()) {
          return false;
        }
#ifdef PICOJSON_USE_INT64
        {
          errno = 0;
          intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
          if (errno == 0
              && std::numeric_limits<int64_t>::min() <= ival
              && ival <= std::numeric_limits<int64_t>::max()
              && endp == num_str.c_str() + num_str.size()) {
            ctx.set_int64(ival);
            return true;
          }
        }
#endif
        f = strtod(num_str.c_str(), &endp);
        if (endp == num_str.c_str() + num_str.size()) {
          ctx.set_number(f);
          return true;
        }
        return false;
      }
      break;
    }
    in.ungetc();
    return false;
  }